

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.cpp
# Opt level: O3

void __thiscall AutoFile::ignore(AutoFile *this,size_t nSize)

{
  long lVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  size_t __n;
  long in_FS_OFFSET;
  uchar data [4096];
  
  data[0x10] = '\0';
  data[0x11] = '\0';
  data[0x12] = '\0';
  data[0x13] = '\0';
  data[0x14] = '\0';
  data[0x15] = '\0';
  data[0x16] = '\0';
  data[0x17] = '\0';
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_file == (FILE *)0x0) {
    pcVar4 = (char *)__cxa_allocate_exception(0x20);
    data._8_8_ = std::iostream_category();
    data[0] = '\x01';
    data[1] = '\0';
    data[2] = '\0';
    data[3] = '\0';
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar4,(error_code *)"AutoFile::ignore: file handle is nullptr");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pcVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  else {
    if (nSize != 0) {
      do {
        __n = 0x1000;
        if (nSize < 0x1000) {
          __n = nSize;
        }
        sVar3 = fread(data,1,__n,(FILE *)this->m_file);
        if (sVar3 != __n) {
          pcVar4 = (char *)__cxa_allocate_exception(0x20);
          iVar2 = feof((FILE *)this->m_file);
          pcVar5 = "AutoFile::ignore: end of file";
          if (iVar2 == 0) {
            pcVar5 = "AutoFile::ignore: fread failed";
          }
          std::iostream_category();
          std::ios_base::failure[abi:cxx11]::failure(pcVar4,(error_code *)pcVar5);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            __cxa_throw(pcVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
                        std::ios_base::failure[abi:cxx11]::~failure);
          }
          goto LAB_0074f046;
        }
        if ((this->m_position).super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long>._M_engaged == true) {
          (this->m_position).super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value =
               (this->m_position).super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long>._M_payload._M_value + __n;
        }
        nSize = nSize - __n;
      } while (nSize != 0);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
LAB_0074f046:
  __stack_chk_fail();
}

Assistant:

void AutoFile::ignore(size_t nSize)
{
    if (!m_file) throw std::ios_base::failure("AutoFile::ignore: file handle is nullptr");
    unsigned char data[4096];
    while (nSize > 0) {
        size_t nNow = std::min<size_t>(nSize, sizeof(data));
        if (std::fread(data, 1, nNow, m_file) != nNow) {
            throw std::ios_base::failure(feof() ? "AutoFile::ignore: end of file" : "AutoFile::ignore: fread failed");
        }
        nSize -= nNow;
        if (m_position.has_value()) *m_position += nNow;
    }
}